

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O0

void borg_free_flow(void)

{
  borg_free_flow_misc();
  borg_free_flow_glyph();
  borg_free_flow_stairs();
  borg_free_track(&track_closed);
  borg_free_track(&track_door);
  borg_free_track(&track_step);
  mem_free(borg_data_icky);
  borg_data_icky = (borg_data *)0x0;
  mem_free(borg_data_know);
  borg_data_know = (borg_data *)0x0;
  mem_free(borg_data_hard);
  borg_data_hard = (borg_data *)0x0;
  mem_free(borg_data_cost);
  borg_data_cost = (borg_data *)0x0;
  mem_free(borg_data_flow);
  borg_data_flow = (borg_data *)0x0;
  return;
}

Assistant:

void borg_free_flow(void)
{
    borg_free_flow_misc();
    borg_free_flow_glyph();
    borg_free_flow_stairs();

    borg_free_track(&track_closed);
    borg_free_track(&track_door);
    borg_free_track(&track_step);

    mem_free(borg_data_icky);
    borg_data_icky = NULL;
    mem_free(borg_data_know);
    borg_data_know = NULL;
    mem_free(borg_data_hard);
    borg_data_hard = NULL;
    mem_free(borg_data_cost);
    borg_data_cost = NULL;
    mem_free(borg_data_flow);
    borg_data_flow = NULL;
}